

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::RepeatedRemoveDirectory(string *dir)

{
  bool bVar1;
  int i;
  uint uVar2;
  
  for (uVar2 = 0; uVar2 != 10; uVar2 = uVar2 + 1) {
    bVar1 = cmsys::SystemTools::RemoveADirectory(dir);
    if (bVar1) break;
    cmsys::SystemTools::Delay(100);
  }
  return uVar2 < 10;
}

Assistant:

bool cmSystemTools::RepeatedRemoveDirectory(const std::string& dir)
{
  // Windows sometimes locks files temporarily so try a few times.
  for (int i = 0; i < 10; ++i) {
    if (cmSystemTools::RemoveADirectory(dir)) {
      return true;
    }
    cmSystemTools::Delay(100);
  }
  return false;
}